

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  options_description_easy_init *poVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  basic_command_line_parser<char> *this;
  size_type sVar5;
  ostream *poVar6;
  difference_type dVar7;
  int iVar8;
  _Bind<bool_(*(std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>))(const_boost::filesystem::path_&)>
  local_2a0;
  options_description local_280 [8];
  options_description desc;
  undefined1 local_200 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1f0 [144];
  allocator local_160 [8];
  positional_options_description pdesc;
  basic_parsed_options<char> local_128;
  undefined1 local_100 [8];
  string input;
  undefined1 auStack_d8 [8];
  Flic flic;
  undefined1 local_58 [8];
  string output;
  allocator local_2a;
  allocator local_29;
  
  boost::program_options::options_description::options_description(local_280,0x50,0x28);
  local_100 = (undefined1  [8])&input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  local_58 = (undefined1  [8])&output._M_string_length;
  output._M_dataplus._M_p = (pointer)0x0;
  output._M_string_length._0_1_ = 0;
  auStack_d8 = (undefined1  [8])boost::program_options::options_description::add_options(local_280);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)auStack_d8,"help","show program help");
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100
                     );
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"input,i",(value_semantic *)ptVar4,
                      "input path to either a Flic file to decompile or a directory of bitmaps to compile"
                     );
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
  ;
  std::__cxx11::string::string((string *)local_200,"",local_160);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_200);
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"output,o",(value_semantic *)ptVar4,
             "output path to either the compiled Flic file or a directory to put decompiled frames in"
            );
  std::__cxx11::string::~string((string *)local_200);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)local_160);
  iVar8 = 1;
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_160,"input",1);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_160,"output",2);
  boost::program_options::variables_map::variables_map((variables_map *)local_200);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)auStack_d8,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)auStack_d8,local_280);
  boost::program_options::detail::cmdline::set_positional_options
            (&this->super_cmdline,(positional_options_description *)local_160);
  boost::program_options::basic_command_line_parser<char>::run(&local_128,this);
  boost::program_options::store((basic_parsed_options *)&local_128,(variables_map *)local_200,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_128.options);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)auStack_d8);
  boost::program_options::notify((variables_map *)local_200);
  std::__cxx11::string::string((string *)auStack_d8,"input",&local_2a);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1f0,(key_type *)auStack_d8);
  if (sVar5 == 0) {
    std::__cxx11::string::~string((string *)auStack_d8);
  }
  else {
    std::__cxx11::string::string((string *)&local_128,"help",&local_29);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1f0,(key_type *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)auStack_d8);
    if (sVar5 == 0) {
      std::__cxx11::string::string((string *)auStack_d8,(string *)local_100);
      bVar1 = boost::filesystem::exists((path *)auStack_d8);
      std::__cxx11::string::~string((string *)auStack_d8);
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: Invalid input path specified: \"");
        poVar6 = std::operator<<(poVar6,(string *)local_100);
        std::operator<<(poVar6,"\" does not exist.\n");
        goto LAB_0012dbfc;
      }
      std::__cxx11::string::string((string *)auStack_d8,(string *)local_100);
      bVar1 = boost::filesystem::is_directory((path *)auStack_d8);
      std::__cxx11::string::~string((string *)auStack_d8);
      if (output._M_dataplus._M_p == (pointer)0x0) {
        std::__cxx11::string::assign(local_58);
      }
      std::__cxx11::string::string((string *)auStack_d8,(string *)local_58);
      bVar2 = boost::filesystem::exists((path *)auStack_d8);
      std::__cxx11::string::~string((string *)auStack_d8);
      if (bVar2) {
        std::__cxx11::string::string((string *)auStack_d8,(string *)local_58);
        bVar2 = boost::filesystem::is_regular_file((path *)auStack_d8);
        std::__cxx11::string::~string((string *)auStack_d8);
        if (!bVar2) {
          std::__cxx11::string::string((string *)auStack_d8,(string *)local_58);
          bVar2 = boost::filesystem::is_directory((path *)auStack_d8);
          std::__cxx11::string::~string((string *)auStack_d8);
          if (bVar2) {
            std::__cxx11::string::string((string *)auStack_d8,(string *)local_58);
            boost::filesystem::directory_iterator::directory_iterator
                      ((directory_iterator *)((long)&output.field_2 + 8),(path *)auStack_d8,none);
            input.field_2._8_8_ = 0;
            local_2a0._M_f = boost::filesystem::is_regular_file;
            local_2a0._M_bound_args.
            super__Tuple_impl<0UL,_std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>_>
            .
            super__Head_base<0UL,_std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>,_false>
            ._M_head_impl._M_f =
                 (offset_in_directory_entry_to_subr)boost::filesystem::directory_entry::path;
            local_2a0._M_bound_args.
            super__Tuple_impl<0UL,_std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>_>
            .
            super__Head_base<0UL,_std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>,_false>
            ._M_head_impl._8_8_ = 0;
            dVar7 = std::
                    count_if<boost::filesystem::directory_iterator,std::_Bind<bool(*(std::_Bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()const>))(boost::filesystem::path_const&)>>
                              ((directory_iterator *)((long)&output.field_2 + 8),
                               (directory_iterator *)((long)&input.field_2 + 8),&local_2a0);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)
                       ((long)&input.field_2 + 8));
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)
                       ((long)&output.field_2 + 8));
            std::__cxx11::string::~string((string *)auStack_d8);
            if (0 < (int)dVar7) {
              poVar6 = std::operator<<((ostream *)&std::cout,"Warning: Output directory \"");
              poVar6 = std::operator<<(poVar6,(string *)local_58);
              std::operator<<(poVar6,
                              "\" isn\'t empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) "
                             );
              bVar2 = prompt();
              goto LAB_0012ddc5;
            }
          }
LAB_0012ddc9:
          if (!bVar1) goto LAB_0012ddf9;
LAB_0012dde0:
          flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          auStack_d8 = (undefined1  [8])0x0;
          Flic::compile((Flic *)auStack_d8,(string *)local_100,(string *)local_58);
          goto LAB_0012de10;
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"Warning: Output file \"");
        poVar6 = std::operator<<(poVar6,(string *)local_58);
        std::operator<<(poVar6,"\" already exists. Overwrite it? (Y to overwrite, default: no) ");
        bVar2 = prompt();
LAB_0012ddc5:
        if (bVar2 != false) goto LAB_0012ddc9;
      }
      else {
        if (bVar1) goto LAB_0012dde0;
        std::__cxx11::string::string((string *)auStack_d8,(string *)local_58);
        bVar1 = boost::filesystem::create_directories((path *)auStack_d8);
        std::__cxx11::string::~string((string *)auStack_d8);
        if (!bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Error: Unable to create output directory \"");
          poVar6 = std::operator<<(poVar6,(string *)local_58);
          poVar6 = std::operator<<(poVar6,
                                   "\". Please make sure that your permissions are set up correctly."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_0012dbfc;
        }
LAB_0012ddf9:
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        auStack_d8 = (undefined1  [8])0x0;
        Flic::decompile((Flic *)auStack_d8,(string *)local_100,(string *)local_58);
LAB_0012de10:
        std::_Vector_base<FlicFrame,_std::allocator<FlicFrame>_>::~_Vector_base
                  ((_Vector_base<FlicFrame,_std::allocator<FlicFrame>_> *)auStack_d8);
      }
      iVar8 = 0;
      goto LAB_0012dbfc;
    }
  }
  showHelp(local_280);
LAB_0012dbfc:
  boost::program_options::variables_map::~variables_map((variables_map *)local_200);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)local_160);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_100);
  boost::program_options::options_description::~options_description(local_280);
  return iVar8;
}

Assistant:

int main(int argc, char **argv) {
	po::options_description desc;
	std::string input, output;
	desc.add_options()
		("help", "show program help")
		("input,i", po::value<std::string>(&input), "input path to either a Flic file to decompile or a directory of bitmaps to compile")
		("output,o", po::value<std::string>(&output)->default_value(""), "output path to either the compiled Flic file or a directory to put decompiled frames in")
	;
	po::positional_options_description pdesc;
	pdesc.add("input", 1);
	pdesc.add("output", 2);

	po::variables_map vm;
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pdesc).run(), vm);
	} catch (po::unknown_option &e) {
		showHelp(desc);
		return 1;
	}
	po::notify(vm);

	// If the user has forgotten to write any arguments or explicitly requested help
	if (!vm.count("input") || vm.count("help")) {
		showHelp(desc);
		return 1;
	}

	// Make sure the input path actually exists
	if (!fs::exists(input)) {
		std::cerr << "Error: Invalid input path specified: \"" << input << "\" does not exist.\n";
		return 1;
	}

	bool compiling = fs::is_directory(input);
	
	if (output.empty()) {
		// We need different default output filenames depending on the desired action
		if (compiling) {
			output = "output.flh";
		} else {
			output = "output";
		}
	}

	if (fs::exists(output)) {
		// We need to check if the user is about to accidentally overwrite already existing files
		if (fs::is_regular_file(output)) {
			std::cout << "Warning: Output file \"" << output << "\" already exists. Overwrite it? (Y to overwrite, default: no) ";
			if (!prompt()) {
				return 0;
			}
		} else if (fs::is_directory(output)) {
			// Check if there are any files in the output directory. Instead of looping through an
			// unknown number of files and checking file names, we just check if the folder isn't
			// empty, in which case we warn the user
			int count = std::count_if(fs::directory_iterator(output), fs::directory_iterator(),
						std::bind(static_cast<bool(*)(const fs::path&)>(fs::is_regular_file), 
						std::bind(&fs::directory_entry::path, std::placeholders::_1)));
			if (count > 0) {
				std::cout << "Warning: Output directory \"" << output << "\" isn't empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) ";
				if (!prompt()) {
					return 0;
				}
			}
		}
	} else if (!compiling) { // If we're decompiling but the output directory doesn't exist, we need to create it
		if (!fs::create_directories(output)) {
			std::cerr << "Error: Unable to create output directory \"" << output << "\". Please make sure that your permissions are set up correctly." << std::endl;
			return 1;
		}
	}

	Flic flic;
	if (compiling) {
		flic.compile(input, output);
	} else {
		flic.decompile(input, output);
	}

	return 0;
}